

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O0

int __thiscall Heuristics::evaluateStateAstar(Heuristics *this,Table currentState)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int local_40;
  int local_3c;
  int j_1;
  int i_1;
  int j;
  int i;
  int number;
  Table initialTable;
  int distance;
  Heuristics *this_local;
  
  initialTable.current_col = 0;
  unique0x1000029b = this;
  Table::Table((Table *)&i);
  j = 0;
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < 3; j_1 = j_1 + 1) {
      cVar1 = Cell::getNumber(currentState.table[i_1] + j_1);
      if (cVar1 != ' ') {
        cVar1 = Cell::getNumber(currentState.table[i_1] + j_1);
        iVar2 = (int)cVar1;
        j = iVar2 + -0x30;
        iVar3 = i_1 - (iVar2 + -0x31) / 3;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        iVar2 = j_1 - (iVar2 + -0x31) % 3;
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        initialTable.current_col = iVar3 + iVar2 + initialTable.current_col;
      }
      iVar3 = i_1 - (j + -1) / 3;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      iVar2 = j_1 - (j + -1) % 3;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      initialTable.current_col = iVar3 + iVar2 + initialTable.current_col;
    }
  }
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      cVar1 = Cell::getNumber(currentState.table[local_3c] + local_40);
      if (cVar1 != ' ') {
        cVar1 = Cell::getNumber(currentState.table[local_3c] + local_40);
        iVar2 = (int)cVar1;
        j = iVar2 + -0x30;
        iVar3 = local_3c - (iVar2 + -0x31) / 3;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        iVar2 = local_40 - (iVar2 + -0x31) % 3;
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        initialTable.current_col = iVar3 + iVar2 + initialTable.current_col;
      }
      iVar3 = local_3c - (j + -1) / 3;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      iVar2 = local_40 - (j + -1) % 3;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      initialTable.current_col = iVar3 + iVar2 + initialTable.current_col;
    }
  }
  return initialTable.current_col;
}

Assistant:

int Heuristics::evaluateStateAstar(Table currentState) {
    int distance = 0;
    Table initialTable = Table();
    int number = 0;
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
            distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
        }
    }
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
            distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
        }
    }
    return distance;
}